

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
IsSubSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *sub_symbol,
           string *super_symbol)

{
  string *__n;
  string *psVar1;
  int iVar2;
  bool bVar3;
  
  __n = (string *)sub_symbol->_M_string_length;
  psVar1 = (string *)super_symbol->_M_string_length;
  if (__n == psVar1) {
    if (__n == (string *)0x0) {
      return true;
    }
    iVar2 = bcmp((sub_symbol->_M_dataplus)._M_p,(super_symbol->_M_dataplus)._M_p,(size_t)__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  bVar3 = false;
  if ((__n <= psVar1) &&
     (iVar2 = std::__cxx11::string::compare((ulong)super_symbol,0,__n), bVar3 = false, iVar2 == 0))
  {
    bVar3 = (super_symbol->_M_dataplus)._M_p[sub_symbol->_M_string_length] == '.';
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::IsSubSymbol(
    const std::string& sub_symbol, const std::string& super_symbol) {
  return sub_symbol == super_symbol ||
         (HasPrefixString(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}